

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime.cpp
# Opt level: O2

void __thiscall Datetime_UTC_Test::TestBody(Datetime_UTC_Test *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"1111-11-11T00:11:01Z",&local_29);
  anon_unknown.dwarf_889ee::test_parsing(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"0014-00-00t03:21:91Z",&local_29);
  anon_unknown.dwarf_889ee::test_parsing(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"1971-11-11t00:11:01z",&local_29);
  anon_unknown.dwarf_889ee::test_parsing(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"1971-01-11t00:11:01Z",&local_29);
  anon_unknown.dwarf_889ee::test_parsing(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(Datetime, UTC) {
    test_parsing("1111-11-11T00:11:01Z");
    test_parsing("0014-00-00t03:21:91Z");
    test_parsing("1971-11-11t00:11:01z");
    test_parsing("1971-01-11t00:11:01Z");
}